

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files,
          string *config)

{
  pointer *pppcVar1;
  iterator __position;
  BT<cmSourceFile_*> *v;
  pointer __args;
  vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> tmp;
  vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> local_30;
  
  GetSourceFilesWithoutObjectLibraries(&local_30,this,config);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::reserve
            (files,((long)local_30.
                          super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_30.
                          super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  for (__args = local_30.
                super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>._M_impl
                .super__Vector_impl_data._M_start;
      __args != local_30.
                super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>._M_impl
                .super__Vector_impl_data._M_finish; __args = __args + 1) {
    __position._M_current =
         (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
      _M_realloc_insert<cmSourceFile*const&>
                ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)files,__position,
                 &__args->Value);
    }
    else {
      *__position._M_current = __args->Value;
      pppcVar1 = &(files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::~vector(&local_30);
  return;
}

Assistant:

void cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries(
  std::vector<cmSourceFile*>& files, const std::string& config) const
{
  std::vector<BT<cmSourceFile*>> tmp =
    this->GetSourceFilesWithoutObjectLibraries(config);
  files.reserve(tmp.size());
  for (BT<cmSourceFile*>& v : tmp) {
    files.push_back(v.Value);
  }
}